

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::writeMatrixConstructor<2,2>
               (ostream *str,Matrix<float,_2,_2> *m)

{
  Matrix<float,_2,_2> *pMVar1;
  ostream *this;
  float *pfVar2;
  int precision;
  string local_40;
  int local_20;
  int local_1c;
  int rowNdx;
  int colNdx;
  Matrix<float,_2,_2> *m_local;
  ostream *str_local;
  
  _rowNdx = m;
  m_local = (Matrix<float,_2,_2> *)str;
  this = std::operator<<(str,"mat");
  std::ostream::operator<<(this,2);
  std::operator<<((ostream *)m_local,"(");
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      if ((0 < local_20) || (0 < local_1c)) {
        std::operator<<((ostream *)m_local,", ");
      }
      pMVar1 = m_local;
      pfVar2 = tcu::Matrix<float,_2,_2>::operator()(_rowNdx,local_20,local_1c);
      de::floatToString_abi_cxx11_(&local_40,(de *)&DAT_00000001,*pfVar2,precision);
      std::operator<<((ostream *)pMVar1,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  std::operator<<((ostream *)m_local,")");
  return;
}

Assistant:

void writeMatrixConstructor (std::ostream& str, const tcu::Matrix<float, Rows, Cols>& m)
{
	if (Rows == Cols)
		str << "mat" << Cols;
	else
		str << "mat" << Cols << "x" << Rows;

	str << "(";
	for (int colNdx = 0; colNdx < Cols; colNdx++)
	{
		for (int rowNdx = 0; rowNdx < Rows; rowNdx++)
		{
			if (rowNdx > 0 || colNdx > 0)
				str << ", ";
			str << de::floatToString(m(rowNdx, colNdx), 1);
		}
	}
	str << ")";
}